

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O3

void __thiscall FScanner::OpenFile(FScanner *this,char *name)

{
  int iVar1;
  BYTE *filebuf;
  FString FStack_38;
  BYTE *local_30;
  
  this->ScriptOpen = false;
  FString::operator=(&this->ScriptBuffer,(char *)"");
  FString::operator=(&this->BigStringBuffer,(char *)"");
  this->StringBuffer[0] = '\0';
  this->String = this->StringBuffer;
  iVar1 = M_ReadFile(name,&local_30);
  FString::FString(&FStack_38,(char *)local_30,(long)iVar1);
  FString::operator=(&this->ScriptBuffer,&FStack_38);
  FString::~FString(&FStack_38);
  if (local_30 != (BYTE *)0x0) {
    operator_delete__(local_30);
  }
  FString::operator=(&this->ScriptName,name);
  this->LumpNum = -1;
  PrepareScript(this);
  return;
}

Assistant:

void FScanner::OpenFile (const char *name)
{
	BYTE *filebuf;
	int filesize;

	Close ();
	filesize = M_ReadFile (name, &filebuf);
	ScriptBuffer = FString((const char *)filebuf, filesize);
	delete[] filebuf;
	ScriptName = name;	// This is used for error messages so the full file name is preferable
	LumpNum = -1;
	PrepareScript ();
}